

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::SwitchHasNestedBreak
          (DeadBranchElimPass *this,uint32_t switch_header_id)

{
  uint32_t id;
  bool bVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  anon_class_24_3_79b30c10 local_80;
  function<bool_(spvtools::opt::Instruction_*)> local_68;
  StructuredCFGAnalysis *local_48;
  StructuredCFGAnalysis *cfg_analysis;
  BasicBlock *pBStack_38;
  uint32_t merge_block_id;
  BasicBlock *start_block;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  block_in_construct;
  uint32_t switch_header_id_local;
  DeadBranchElimPass *this_local;
  
  block_in_construct.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = switch_header_id;
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &start_block);
  pIVar2 = Pass::context((Pass *)this);
  pBStack_38 = IRContext::get_instr_block
                         (pIVar2,block_in_construct.
                                 super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  cfg_analysis._4_4_ = BasicBlock::MergeBlockIdIfAny(pBStack_38);
  pIVar2 = Pass::context((Pass *)this);
  local_48 = IRContext::GetStructuredCFGAnalysis(pIVar2);
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  id = cfg_analysis._4_4_;
  local_80.cfg_analysis = local_48;
  local_80.switch_header_id =
       block_in_construct.
       super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_80.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::DeadBranchElimPass::SwitchHasNestedBreak(unsigned_int)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_68,&local_80);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,id,&local_68);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_68);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::~vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &start_block);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool DeadBranchElimPass::SwitchHasNestedBreak(uint32_t switch_header_id) {
  std::vector<BasicBlock*> block_in_construct;
  BasicBlock* start_block = context()->get_instr_block(switch_header_id);
  uint32_t merge_block_id = start_block->MergeBlockIdIfAny();

  StructuredCFGAnalysis* cfg_analysis = context()->GetStructuredCFGAnalysis();
  return !get_def_use_mgr()->WhileEachUser(
      merge_block_id,
      [this, cfg_analysis, switch_header_id](Instruction* inst) {
        if (!inst->IsBranch()) {
          return true;
        }

        BasicBlock* bb = context()->get_instr_block(inst);
        if (bb->id() == switch_header_id) {
          return true;
        }
        return (cfg_analysis->ContainingConstruct(inst) == switch_header_id &&
                bb->GetMergeInst() == nullptr);
      });
}